

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O1

BOOL PAL_LOADUnloadPEFile(void *ptr)

{
  BOOL BVar1;
  
  if (PAL_InitializeChakraCoreCalled) {
    if (ptr == (void *)0x0) {
      BVar1 = 0;
    }
    else {
      BVar1 = MAPUnmapPEFile(ptr);
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return BVar1;
    }
  }
  abort();
}

Assistant:

BOOL
PALAPI
PAL_LOADUnloadPEFile(void * ptr)
{
    BOOL retval = FALSE;

    ENTRY("PAL_LOADUnloadPEFile (ptr=%p)\n", ptr);

    if (nullptr == ptr)
    {
        ERROR( "Invalid pointer value\n" );
    }
    else
    {
        retval = MAPUnmapPEFile(ptr);
    }

    LOGEXIT("PAL_LOADUnloadPEFile returns %d\n", retval);
    return retval;
}